

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O1

void array_sum_bang(t_array_rangeop *x)

{
  int iVar1;
  float f;
  int nitem;
  int stride;
  char *firstitem;
  int arrayonset;
  int local_20;
  int local_1c;
  float *local_18;
  int local_c;
  
  iVar1 = array_rangeop_getrange(x,(char **)&local_18,&local_20,&local_1c,&local_c);
  if (iVar1 == 0) {
    return;
  }
  if (local_20 < 1) {
    f = 0.0;
  }
  else {
    f = 0.0;
    do {
      f = f + *local_18;
      local_18 = (float *)((long)local_18 + (long)local_1c);
      local_20 = local_20 + -1;
    } while (local_20 != 0);
  }
  outlet_float((x->x_tc).tc_obj.te_outlet,f);
  return;
}

Assistant:

static void array_sum_bang(t_array_rangeop *x)
{
    char *itemp, *firstitem;
    int stride, nitem, arrayonset, i;
    double sum;
    if (!array_rangeop_getrange(x, &firstitem, &nitem, &stride, &arrayonset))
        return;
    for (i = 0, sum = 0, itemp = firstitem; i < nitem; i++, itemp += stride)
        sum += *(t_float *)itemp;
    outlet_float(x->x_outlet, sum);
}